

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O3

uint __thiscall ON_SubDFace::PackRectRotationDegrees(ON_SubDFace *this)

{
  return (this->m_pack_status_bits & 3) * 0x5a &
         (int)((uint)this->m_pack_status_bits << 0x1d) >> 0x1f;
}

Assistant:

unsigned int ON_SubDFace::PackRectRotationDegrees() const
{
  if (0 == (m_pack_status_bits & ON_SubDFace::PackStatusBits::PackRectSet))
    return 0;
  unsigned int packing_rotation_degrees = 0;
  switch (m_pack_status_bits & ON_SubDFace::PackStatusBits::PackingRotateMask)
  {
  case ON_SubDFace::PackStatusBits::PackingRotate90:
    packing_rotation_degrees = 90;
    break;
  case ON_SubDFace::PackStatusBits::PackingRotate180:
    packing_rotation_degrees = 180;
    break;
  case ON_SubDFace::PackStatusBits::PackingRotate270:
    packing_rotation_degrees = 270;
    break;
  }
  return packing_rotation_degrees;
}